

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O0

ir_function_signature * __thiscall
anon_unknown.dwarf_b1ea9::builtin_builder::_invocation_interlock
          (builtin_builder *this,char *intrinsic_name,builtin_available_predicate avail)

{
  ir_function *f;
  ir_call *ir;
  undefined1 local_38 [8];
  ir_factory body;
  ir_function_signature *sig;
  builtin_available_predicate avail_local;
  char *intrinsic_name_local;
  builtin_builder *this_local;
  
  body.mem_ctx = new_sig(this,&glsl_type::_void_type,avail,0);
  ir_builder::ir_factory::ir_factory
            ((ir_factory *)local_38,&((ir_function_signature *)body.mem_ctx)->body,this->mem_ctx);
  *(byte *)((long)body.mem_ctx + 0x48) = *(byte *)((long)body.mem_ctx + 0x48) & 0xfe | 1;
  f = glsl_symbol_table::get_function(this->shader->symbols,intrinsic_name);
  ir = call(this,f,(ir_variable *)0x0,*(exec_list *)((long)body.mem_ctx + 0x28));
  ir_builder::ir_factory::emit((ir_factory *)local_38,&ir->super_ir_instruction);
  return (ir_function_signature *)body.mem_ctx;
}

Assistant:

ir_function_signature *
builtin_builder::_invocation_interlock(const char *intrinsic_name,
                                       builtin_available_predicate avail)
{
   MAKE_SIG(glsl_type::void_type, avail, 0);
   body.emit(call(shader->symbols->get_function(intrinsic_name),
                  NULL, sig->parameters));
   return sig;
}